

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyStrToInt32(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ushort **ppuVar6;
  short sVar8;
  char *pcVar9;
  char *pcVar10;
  short sVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  bool bVar16;
  ushort *puVar7;
  
  pcVar14 = zSrc + nLen;
  bVar16 = false;
  if (nLen != 0) {
    ppuVar6 = __ctype_b_loc();
    do {
      cVar1 = *zSrc;
      if ((*(byte *)((long)*ppuVar6 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        if ((cVar1 == '+') || (cVar1 == '-')) {
          bVar16 = cVar1 == '-';
          goto LAB_00122be2;
        }
        break;
      }
      zSrc = zSrc + 1;
    } while (zSrc < pcVar14);
  }
  for (; (zSrc < pcVar14 && (*zSrc == '0')); zSrc = zSrc + 1) {
LAB_00122be2:
  }
  uVar4 = (int)pcVar14 - (int)zSrc;
  sVar8 = 10;
  if (9 < uVar4) {
    pcVar10 = "2147483648";
    if (!bVar16) {
      pcVar10 = "2147483647";
    }
    uVar4 = SyMemcmp(zSrc,pcVar10,nLen);
    sVar8 = ((int)uVar4 < 1) + 9;
  }
  puVar7 = (ushort *)(ulong)uVar4;
  iVar15 = 0;
  pcVar10 = zSrc;
  if (zSrc < pcVar14) {
    ppuVar6 = __ctype_b_loc();
    puVar7 = *ppuVar6;
    lVar12 = 0;
    iVar15 = 0;
    pcVar13 = zSrc;
    do {
      if ((*(byte *)((long)puVar7 + (long)zSrc[lVar12] * 2 + 1) & 8) == 0) {
        pcVar10 = zSrc + lVar12;
        goto LAB_00122d4a;
      }
      iVar15 = (int)zSrc[lVar12] + iVar15 * 10 + -0x30;
      pcVar10 = zSrc + lVar12 + 1;
      if ((pcVar14 <= pcVar10) || (sVar11 = (short)lVar12, (short)(sVar8 + -1) == sVar11))
      goto LAB_00122d4a;
      if ((*(byte *)((long)puVar7 + (long)*pcVar10 * 2 + 1) & 8) == 0) {
        pcVar10 = pcVar13 + 1;
        goto LAB_00122d4a;
      }
      iVar15 = (int)*pcVar10 + iVar15 * 10 + -0x30;
      pcVar9 = zSrc + lVar12 + 2;
      pcVar10 = pcVar13 + 2;
      if (((pcVar14 <= pcVar9) || ((short)(sVar8 + -2) == sVar11)) ||
         (pcVar10 = pcVar9, (*(byte *)((long)puVar7 + (long)*pcVar9 * 2 + 1) & 8) == 0))
      goto LAB_00122d4a;
      iVar15 = (int)*pcVar9 + iVar15 * 10 + -0x30;
      pcVar10 = zSrc + lVar12 + 3;
      if ((pcVar14 <= pcVar10) || ((short)(sVar8 + -3) == sVar11)) goto LAB_00122d4a;
      if ((*(byte *)((long)puVar7 + (long)*pcVar10 * 2 + 1) & 8) == 0) {
        pcVar10 = pcVar13 + 3;
        goto LAB_00122d4a;
      }
      iVar15 = (int)*pcVar10 + iVar15 * 10 + -0x30;
      lVar3 = lVar12 + 4;
      lVar12 = lVar12 + 4;
    } while ((zSrc + lVar3 < pcVar14) && (pcVar13 = pcVar13 + 4, (short)(sVar8 + -4) != sVar11));
    pcVar10 = zSrc + lVar12;
  }
LAB_00122d4a:
  if (pcVar10 < pcVar14) {
    ppuVar6 = __ctype_b_loc();
    puVar7 = *ppuVar6;
    bVar2 = *(byte *)((long)puVar7 + (long)*pcVar10 * 2 + 1);
    while (((bVar2 & 0x20) != 0 && (pcVar10 = pcVar10 + 1, pcVar10 < pcVar14))) {
      bVar2 = *(byte *)((long)puVar7 + (long)*pcVar10 * 2 + 1);
    }
  }
  iVar5 = (int)puVar7;
  if (pOutVal != (void *)0x0) {
    iVar5 = -iVar15;
    if (iVar15 == 0) {
      iVar5 = iVar15;
    }
    if (!bVar16) {
      iVar5 = iVar15;
    }
    *(int *)pOutVal = iVar5;
  }
  return iVar5;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToInt32(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	int isNeg = FALSE;
	const char *zEnd;
	sxi32 nVal = 0;
	sxi16 i;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	i = 10;
	if( (sxu32)(zEnd-zSrc) >= 10 ){
		/* Handle overflow */
		i = SyMemcmp(zSrc, (isNeg == TRUE) ? SXINT32_MIN_STR : SXINT32_MAX_STR, nLen) <= 0 ? 10 : 9; 
	}
	for(;;){
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = (char *)zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi32 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}